

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_257da9::writeData(ostream *os)

{
  byte bVar1;
  basic_ostream<char,_std::char_traits<char>_> *in_RDI;
  uint64_t in_stack_ffffffffffffffd8;
  float v;
  basic_ostream<char,_std::char_traits<char>_> *out;
  int n;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  basic_ostream<char,_std::char_traits<char>_> *out_00;
  double in_stack_ffffffffffffffe8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffff0;
  
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,SUB81(in_stack_ffffffffffffffd8 >> 0x38,0));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,SUB81(in_stack_ffffffffffffffd8 >> 0x38,0));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(char)(in_stack_ffffffffffffffd8 >> 0x38));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(char)(in_stack_ffffffffffffffd8 >> 0x38));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(char)(in_stack_ffffffffffffffd8 >> 0x38));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(char)(in_stack_ffffffffffffffd8 >> 0x38));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(uchar)(in_stack_ffffffffffffffd8 >> 0x38));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(uchar)(in_stack_ffffffffffffffd8 >> 0x38));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(short)(in_stack_ffffffffffffffd8 >> 0x30));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(short)(in_stack_ffffffffffffffd8 >> 0x30));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(unsigned_short)(in_stack_ffffffffffffffd8 >> 0x30));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(unsigned_short)(in_stack_ffffffffffffffd8 >> 0x30));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(int)(in_stack_ffffffffffffffd8 >> 0x20));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(int)(in_stack_ffffffffffffffd8 >> 0x20));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(uint)(in_stack_ffffffffffffffd8 >> 0x20));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,(uint)(in_stack_ffffffffffffffd8 >> 0x20));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  v = (float)(in_stack_ffffffffffffffd8 >> 0x20);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(in_stack_ffffffffffffffe0,v);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(in_stack_ffffffffffffffe0,v);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(in_stack_ffffffffffffffe0,v);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  out = in_RDI;
  Imath_3_2::half::half((half *)in_stack_ffffffffffffffe0,(float)((ulong)in_RDI >> 0x20));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (out,(half)(uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x30));
  out_00 = in_RDI;
  Imath_3_2::half::half((half *)in_RDI,(float)((ulong)out >> 0x20));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (out,(half)(uint16_t)((ulong)out_00 >> 0x30));
  Imath_3_2::half::half((half *)out_00,(float)((ulong)out >> 0x20));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>
            (out,(half)(uint16_t)((ulong)out_00 >> 0x30));
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,(char *)out,0);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,(char *)out,0);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,(char *)out);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,(char *)out);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,(char *)out);
  n = (int)((ulong)out >> 0x20);
  Imf_3_4::Xdr::pad<(anonymous_namespace)::CharIO,std::ostream>(out_00,n);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,n);
  Imf_3_4::Xdr::pad<(anonymous_namespace)::CharIO,std::ostream>(out_00,n);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,n);
  Imf_3_4::Xdr::pad<(anonymous_namespace)::CharIO,std::ostream>(out_00,n);
  Imf_3_4::Xdr::write<(anonymous_namespace)::CharIO,std::ostream>(out_00,n);
  bVar1 = std::ios::operator!((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if ((bVar1 & 1) == 0) {
    return;
  }
  __assert_fail("!os == false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,0x58,"void (anonymous namespace)::writeData(ostream &)");
}

Assistant:

void
writeData (ostream& os)
{
    Xdr::write<CharIO> (os, (bool) true);
    Xdr::write<CharIO> (os, (bool) false);
    Xdr::write<CharIO> (os, (char) 'r');
    Xdr::write<CharIO> (os, (char) 'e');
    Xdr::write<CharIO> (os, (signed char) 'u');
    Xdr::write<CharIO> (os, (signed char) 'c');
    Xdr::write<CharIO> (os, (unsigned char) 'k');
    Xdr::write<CharIO> (os, (unsigned char) 'y');
    Xdr::write<CharIO> (os, (signed short) 8765);
    Xdr::write<CharIO> (os, (signed short) -9876);
    Xdr::write<CharIO> (os, (unsigned short) 6543);
    Xdr::write<CharIO> (os, (unsigned short) 17432);
    Xdr::write<CharIO> (os, (signed int) 2023456789);
    Xdr::write<CharIO> (os, (signed int) -2012345678);
    Xdr::write<CharIO> (os, (unsigned int) 1234567890u);
    Xdr::write<CharIO> (os, (unsigned int) 2345678901u);
    Xdr::write<CharIO> (os, (int64_t) 2034567890);
    Xdr::write<CharIO> (os, (int64_t) -2045678901);
    Xdr::write<CharIO> (os, (uint64_t) 1345678901u);
    Xdr::write<CharIO> (os, (uint64_t) 2456789012u);
    Xdr::write<CharIO> (os, (uint64_t) 0x1122334455667788ll);
    Xdr::write<CharIO> (os, (uint64_t) 0xf1f2f3f4f5f6f7f8ll);
    Xdr::write<CharIO> (os, (float) 0.0f);
    Xdr::write<CharIO> (os, (float) 3.141592653589793f);
    Xdr::write<CharIO> (os, (float) 6.141592653589793f);
    Xdr::write<CharIO> (os, (double) 0);
    Xdr::write<CharIO> (os, (double) 1.41421356237309504880);
    Xdr::write<CharIO> (os, (double) 2.41421356237309504880);
    Xdr::write<CharIO> (os, (half) 0);
    Xdr::write<CharIO> (os, (half) 3.4142);
    Xdr::write<CharIO> (os, (half) 4.4142);
    Xdr::write<CharIO> (os, "abcdefgh", 4); // fixed-size char array
    Xdr::write<CharIO> (os, "rstuvwxy", 5);
    Xdr::write<CharIO> (os, "qwerty"); // zero-terminated string
    Xdr::write<CharIO> (os, "asdfghjkl");
    Xdr::write<CharIO> (os, "");
    Xdr::pad<CharIO> (os, 17);
    Xdr::write<CharIO> (os, (int) 1);
    Xdr::pad<CharIO> (os, 0);
    Xdr::write<CharIO> (os, (int) 2);
    Xdr::pad<CharIO> (os, 17);
    Xdr::write<CharIO> (os, (int) 3);

    assert (!os == false);
}